

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

BBox3fa * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
         *this,Vec3fa *ofs,float scale,float r_scale0,LinearSpace3fa *space,size_t i,size_t itime)

{
  float *pfVar1;
  float fVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  uint uVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  char *pcVar7;
  size_t sVar8;
  char *pcVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [12];
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar41 [32];
  undefined4 uVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar40 [32];
  undefined1 auVar53 [32];
  
  fVar10 = scale * r_scale0;
  pBVar6 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           vertices.items;
  uVar5 = *(uint *)(*(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                 super_CurveGeometry.field_0x68);
  pcVar7 = pBVar6[itime].super_RawBufferView.ptr_ofs;
  sVar8 = pBVar6[itime].super_RawBufferView.stride;
  lVar17 = sVar8 * uVar5;
  lVar20 = sVar8 * (uVar5 + 1);
  pBVar6 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           tangents.items;
  pcVar9 = pBVar6[itime].super_RawBufferView.ptr_ofs;
  sVar8 = pBVar6[itime].super_RawBufferView.stride;
  lVar18 = uVar5 * sVar8;
  lVar19 = sVar8 * (uVar5 + 1);
  auVar38 = vsubps_avx(*(undefined1 (*) [16])(pcVar7 + lVar17),(undefined1  [16])ofs->field_0);
  auVar37._0_4_ = scale * auVar38._0_4_;
  auVar37._4_4_ = scale * auVar38._4_4_;
  auVar37._8_4_ = scale * auVar38._8_4_;
  auVar37._12_4_ = scale * auVar38._12_4_;
  auVar45._4_4_ = auVar37._0_4_;
  auVar45._0_4_ = auVar37._0_4_;
  auVar45._8_4_ = auVar37._0_4_;
  auVar45._12_4_ = auVar37._0_4_;
  auVar38 = vshufps_avx(auVar37,auVar37,0x55);
  aVar3 = (space->vx).field_0;
  auVar37 = vshufps_avx(auVar37,auVar37,0xaa);
  aVar4 = (space->vy).field_0;
  fVar13 = (space->vz).field_0.m128[0];
  fVar14 = (space->vz).field_0.m128[1];
  fVar15 = (space->vz).field_0.m128[2];
  fVar16 = (space->vz).field_0.m128[3];
  auVar61._0_4_ = fVar13 * auVar37._0_4_;
  auVar61._4_4_ = fVar14 * auVar37._4_4_;
  auVar61._8_4_ = fVar15 * auVar37._8_4_;
  auVar61._12_4_ = fVar16 * auVar37._12_4_;
  auVar38 = vfmadd231ps_fma(auVar61,(undefined1  [16])aVar4,auVar38);
  auVar43 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar3,auVar45);
  fVar2 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
          maxRadiusScale;
  fVar11 = fVar10 * fVar2 * *(float *)(pcVar7 + lVar17 + 0xc);
  auVar38._4_4_ = fVar11;
  auVar38._0_4_ = fVar11;
  auVar38._8_4_ = fVar11;
  auVar38._12_4_ = fVar11;
  auVar40._16_4_ = fVar11;
  auVar40._0_16_ = auVar38;
  auVar40._20_4_ = fVar11;
  auVar40._24_4_ = fVar11;
  auVar40._28_4_ = fVar11;
  auVar38 = vinsertps_avx(auVar43,auVar38,0x30);
  auVar37 = vsubps_avx(*(undefined1 (*) [16])(pcVar7 + lVar20),(undefined1  [16])ofs->field_0);
  auVar46._0_4_ = scale * auVar37._0_4_;
  auVar46._4_4_ = scale * auVar37._4_4_;
  auVar46._8_4_ = scale * auVar37._8_4_;
  auVar46._12_4_ = scale * auVar37._12_4_;
  auVar48._4_4_ = auVar46._0_4_;
  auVar48._0_4_ = auVar46._0_4_;
  auVar48._8_4_ = auVar46._0_4_;
  auVar48._12_4_ = auVar46._0_4_;
  auVar37 = vshufps_avx(auVar46,auVar46,0x55);
  auVar45 = vshufps_avx(auVar46,auVar46,0xaa);
  auVar47._0_4_ = fVar13 * auVar45._0_4_;
  auVar47._4_4_ = fVar14 * auVar45._4_4_;
  auVar47._8_4_ = fVar15 * auVar45._8_4_;
  auVar47._12_4_ = fVar16 * auVar45._12_4_;
  auVar37 = vfmadd231ps_fma(auVar47,(undefined1  [16])aVar4,auVar37);
  auVar46 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar3,auVar48);
  fVar11 = fVar10 * fVar2 * *(float *)(pcVar7 + lVar20 + 0xc);
  auVar52._4_4_ = fVar11;
  auVar52._0_4_ = fVar11;
  auVar52._8_4_ = fVar11;
  auVar52._12_4_ = fVar11;
  auVar53._16_4_ = fVar11;
  auVar53._0_16_ = auVar52;
  auVar53._20_4_ = fVar11;
  auVar53._24_4_ = fVar11;
  auVar53._28_4_ = fVar11;
  auVar37 = vinsertps_avx(auVar46,auVar52,0x30);
  pfVar1 = (float *)(pcVar9 + lVar18);
  auVar50._0_4_ = scale * *pfVar1;
  auVar50._4_4_ = scale * pfVar1[1];
  auVar50._8_4_ = scale * pfVar1[2];
  auVar50._12_4_ = scale * pfVar1[3];
  auVar62._4_4_ = auVar50._0_4_;
  auVar62._0_4_ = auVar50._0_4_;
  auVar62._8_4_ = auVar50._0_4_;
  auVar62._12_4_ = auVar50._0_4_;
  auVar45 = vshufps_avx(auVar50,auVar50,0x55);
  auVar44 = vshufps_avx(auVar50,auVar50,0xaa);
  auVar51._0_4_ = fVar13 * auVar44._0_4_;
  auVar51._4_4_ = fVar14 * auVar44._4_4_;
  auVar51._8_4_ = fVar15 * auVar44._8_4_;
  auVar51._12_4_ = fVar16 * auVar44._12_4_;
  auVar45 = vfmadd231ps_fma(auVar51,(undefined1  [16])aVar4,auVar45);
  auVar45 = vfmadd231ps_fma(auVar45,(undefined1  [16])aVar3,auVar62);
  auVar45 = vinsertps_avx(auVar45,ZEXT416((uint)(fVar2 * *(float *)(pcVar9 + lVar18 + 0xc) * fVar10)
                                         ),0x30);
  pfVar1 = (float *)(pcVar9 + lVar19);
  auVar55._0_4_ = scale * *pfVar1;
  auVar55._4_4_ = scale * pfVar1[1];
  auVar55._8_4_ = scale * pfVar1[2];
  auVar55._12_4_ = scale * pfVar1[3];
  auVar63._4_4_ = auVar55._0_4_;
  auVar63._0_4_ = auVar55._0_4_;
  auVar63._8_4_ = auVar55._0_4_;
  auVar63._12_4_ = auVar55._0_4_;
  auVar44 = vshufps_avx(auVar55,auVar55,0x55);
  auVar39 = vshufps_avx(auVar55,auVar55,0xaa);
  auVar56._0_4_ = fVar13 * auVar39._0_4_;
  auVar56._4_4_ = fVar14 * auVar39._4_4_;
  auVar56._8_4_ = fVar15 * auVar39._8_4_;
  auVar56._12_4_ = fVar16 * auVar39._12_4_;
  auVar44 = vfmadd231ps_fma(auVar56,(undefined1  [16])aVar4,auVar44);
  auVar44 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar3,auVar63);
  auVar44 = vinsertps_avx(auVar44,ZEXT416((uint)(fVar10 * fVar2 * *(float *)(pcVar9 + lVar19 + 0xc))
                                         ),0x30);
  auVar57._8_4_ = 0xbeaaaaab;
  auVar57._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar57._12_4_ = 0xbeaaaaab;
  auVar45 = vfnmadd213ps_fma(auVar45,auVar57,auVar38);
  auVar38 = vfmadd213ps_fma(auVar44,auVar57,auVar37);
  uVar42 = auVar43._0_4_;
  auVar58._4_4_ = uVar42;
  auVar58._0_4_ = uVar42;
  auVar58._8_4_ = uVar42;
  auVar58._12_4_ = uVar42;
  auVar58._16_4_ = uVar42;
  auVar58._20_4_ = uVar42;
  auVar58._24_4_ = uVar42;
  auVar58._28_4_ = uVar42;
  auVar30._8_4_ = 1;
  auVar30._0_8_ = 0x100000001;
  auVar30._12_4_ = 1;
  auVar30._16_4_ = 1;
  auVar30._20_4_ = 1;
  auVar30._24_4_ = 1;
  auVar30._28_4_ = 1;
  auVar35 = vpermps_avx2(auVar30,ZEXT1632(auVar43));
  auVar25._8_4_ = 2;
  auVar25._0_8_ = 0x200000002;
  auVar25._12_4_ = 2;
  auVar25._16_4_ = 2;
  auVar25._20_4_ = 2;
  auVar25._24_4_ = 2;
  auVar25._28_4_ = 2;
  auVar36 = vpermps_avx2(auVar25,ZEXT1632(auVar43));
  uVar42 = auVar45._0_4_;
  auVar64._4_4_ = uVar42;
  auVar64._0_4_ = uVar42;
  auVar64._8_4_ = uVar42;
  auVar64._12_4_ = uVar42;
  auVar64._16_4_ = uVar42;
  auVar64._20_4_ = uVar42;
  auVar64._24_4_ = uVar42;
  auVar64._28_4_ = uVar42;
  auVar34 = ZEXT1632(auVar45);
  auVar32 = vpermps_avx2(auVar30,auVar34);
  auVar33 = vpermps_avx2(auVar25,auVar34);
  auVar23._8_4_ = 3;
  auVar23._0_8_ = 0x300000003;
  auVar23._12_4_ = 3;
  auVar23._16_4_ = 3;
  auVar23._20_4_ = 3;
  auVar23._24_4_ = 3;
  auVar23._28_4_ = 3;
  auVar34 = vpermps_avx2(auVar23,auVar34);
  uVar42 = auVar38._0_4_;
  auVar65._4_4_ = uVar42;
  auVar65._0_4_ = uVar42;
  auVar65._8_4_ = uVar42;
  auVar65._12_4_ = uVar42;
  auVar65._16_4_ = uVar42;
  auVar65._20_4_ = uVar42;
  auVar65._24_4_ = uVar42;
  auVar65._28_4_ = uVar42;
  auVar31 = ZEXT1632(auVar38);
  auVar21 = vpermps_avx512vl(auVar30,auVar31);
  auVar22 = vpermps_avx512vl(auVar25,auVar31);
  auVar31 = vpermps_avx2(auVar23,auVar31);
  auVar23 = vbroadcastss_avx512vl(auVar46);
  auVar24 = vpermps_avx512vl(auVar30,ZEXT1632(auVar46));
  auVar30 = vpermps_avx2(auVar25,ZEXT1632(auVar46));
  auVar25 = vmulps_avx512vl(auVar23,bezier_basis0._3944_32_);
  auVar26 = vmulps_avx512vl(auVar24,bezier_basis0._3944_32_);
  auVar27._4_4_ = auVar30._4_4_ * bezier_basis0._3948_4_;
  auVar27._0_4_ = auVar30._0_4_ * bezier_basis0._3944_4_;
  auVar27._8_4_ = auVar30._8_4_ * bezier_basis0._3952_4_;
  auVar27._12_4_ = auVar30._12_4_ * bezier_basis0._3956_4_;
  auVar27._16_4_ = auVar30._16_4_ * bezier_basis0._3960_4_;
  auVar27._20_4_ = auVar30._20_4_ * bezier_basis0._3964_4_;
  auVar27._24_4_ = auVar30._24_4_ * bezier_basis0._3968_4_;
  auVar27._28_4_ = 1;
  auVar28._4_4_ = fVar11 * bezier_basis0._3948_4_;
  auVar28._0_4_ = fVar11 * bezier_basis0._3944_4_;
  auVar28._8_4_ = fVar11 * bezier_basis0._3952_4_;
  auVar28._12_4_ = fVar11 * bezier_basis0._3956_4_;
  auVar28._16_4_ = fVar11 * bezier_basis0._3960_4_;
  auVar28._20_4_ = fVar11 * bezier_basis0._3964_4_;
  auVar28._24_4_ = fVar11 * bezier_basis0._3968_4_;
  auVar28._28_4_ = bezier_basis0._3972_4_;
  auVar25 = vfmadd231ps_avx512vl(auVar25,bezier_basis0._2788_32_,auVar65);
  auVar26 = vfmadd231ps_avx512vl(auVar26,bezier_basis0._2788_32_,auVar21);
  auVar27 = vfmadd231ps_avx512vl(auVar27,bezier_basis0._2788_32_,auVar22);
  auVar28 = vfmadd231ps_avx512vl(auVar28,auVar31,bezier_basis0._2788_32_);
  auVar25 = vfmadd231ps_avx512vl(auVar25,bezier_basis0._1632_32_,auVar64);
  auVar26 = vfmadd231ps_avx512vl(auVar26,bezier_basis0._1632_32_,auVar32);
  auVar27 = vfmadd231ps_avx512vl(auVar27,bezier_basis0._1632_32_,auVar33);
  auVar28 = vfmadd231ps_avx512vl(auVar28,auVar34,bezier_basis0._1632_32_);
  auVar25 = vfmadd231ps_avx512vl(auVar25,bezier_basis0._476_32_,auVar58);
  auVar26 = vfmadd231ps_avx512vl(auVar26,bezier_basis0._476_32_,auVar35);
  auVar29 = vfmadd231ps_avx512vl(auVar27,bezier_basis0._476_32_,auVar36);
  auVar28 = vfmadd231ps_avx512vl(auVar28,auVar40,bezier_basis0._476_32_);
  auVar27 = vmulps_avx512vl(auVar23,bezier_basis0._8568_32_);
  auVar23 = vmulps_avx512vl(auVar24,bezier_basis0._8568_32_);
  auVar30 = vmulps_avx512vl(auVar30,bezier_basis0._8568_32_);
  auVar24 = vmulps_avx512vl(auVar53,bezier_basis0._8568_32_);
  auVar27 = vfmadd231ps_avx512vl(auVar27,bezier_basis0._7412_32_,auVar65);
  auVar21 = vfmadd231ps_avx512vl(auVar23,bezier_basis0._7412_32_,auVar21);
  auVar30 = vfmadd231ps_avx512vl(auVar30,bezier_basis0._7412_32_,auVar22);
  auVar31 = vfmadd231ps_avx512vl(auVar24,bezier_basis0._7412_32_,auVar31);
  auVar27 = vfmadd231ps_avx512vl(auVar27,bezier_basis0._6256_32_,auVar64);
  auVar32 = vfmadd231ps_avx512vl(auVar21,bezier_basis0._6256_32_,auVar32);
  auVar33 = vfmadd231ps_avx512vl(auVar30,bezier_basis0._6256_32_,auVar33);
  auVar34 = vfmadd231ps_avx512vl(auVar31,bezier_basis0._6256_32_,auVar34);
  auVar31 = vfmadd231ps_avx512vl(auVar27,bezier_basis0._5100_32_,auVar58);
  auVar35 = vfmadd231ps_avx512vl(auVar32,bezier_basis0._5100_32_,auVar35);
  auVar32 = vfmadd231ps_avx512vl(auVar33,bezier_basis0._5100_32_,auVar36);
  auVar24._8_4_ = 0x3d638e39;
  auVar24._0_8_ = 0x3d638e393d638e39;
  auVar24._12_4_ = 0x3d638e39;
  auVar24._16_4_ = 0x3d638e39;
  auVar24._20_4_ = 0x3d638e39;
  auVar24._24_4_ = 0x3d638e39;
  auVar24._28_4_ = 0x3d638e39;
  auVar33 = vfmadd231ps_avx512vl(auVar34,bezier_basis0._5100_32_,auVar40);
  auVar23 = vmulps_avx512vl(auVar31,auVar24);
  auVar24 = vmulps_avx512vl(auVar35,auVar24);
  auVar21._4_4_ = auVar32._4_4_ * 0.055555556;
  auVar21._0_4_ = auVar32._0_4_ * 0.055555556;
  auVar21._8_4_ = auVar32._8_4_ * 0.055555556;
  auVar21._12_4_ = auVar32._12_4_ * 0.055555556;
  auVar21._16_4_ = auVar32._16_4_ * 0.055555556;
  auVar21._20_4_ = auVar32._20_4_ * 0.055555556;
  auVar21._24_4_ = auVar32._24_4_ * 0.055555556;
  auVar21._28_4_ = auVar36._28_4_;
  auVar22._4_4_ = auVar33._4_4_ * 0.055555556;
  auVar22._0_4_ = auVar33._0_4_ * 0.055555556;
  auVar22._8_4_ = auVar33._8_4_ * 0.055555556;
  auVar22._12_4_ = auVar33._12_4_ * 0.055555556;
  auVar22._16_4_ = auVar33._16_4_ * 0.055555556;
  auVar22._20_4_ = auVar33._20_4_ * 0.055555556;
  auVar22._24_4_ = auVar33._24_4_ * 0.055555556;
  auVar22._28_4_ = auVar33._28_4_;
  auVar12 = ZEXT812(0);
  auVar35 = vblendps_avx(auVar23,ZEXT1232(auVar12) << 0x20,1);
  auVar36 = vblendps_avx(auVar24,ZEXT1232(auVar12) << 0x20,1);
  auVar40 = ZEXT1232(auVar12) << 0x20;
  auVar32 = vblendps_avx(auVar21,auVar40,1);
  auVar33 = vblendps_avx(auVar22,auVar40,1);
  auVar34 = vsubps_avx(auVar25,auVar35);
  auVar31 = vsubps_avx(auVar26,auVar36);
  auVar30 = vsubps_avx(auVar29,auVar32);
  auVar27 = vsubps_avx(auVar28,auVar33);
  auVar35 = vblendps_avx(auVar23,auVar40,0x80);
  auVar36 = vblendps_avx(auVar24,auVar40,0x80);
  auVar32 = vblendps_avx(auVar21,ZEXT1232(auVar12) << 0x20,0x80);
  auVar33 = vblendps_avx(auVar22,ZEXT1232(auVar12) << 0x20,0x80);
  auVar41._0_4_ = auVar25._0_4_ + auVar35._0_4_;
  auVar41._4_4_ = auVar25._4_4_ + auVar35._4_4_;
  auVar41._8_4_ = auVar25._8_4_ + auVar35._8_4_;
  auVar41._12_4_ = auVar25._12_4_ + auVar35._12_4_;
  auVar41._16_4_ = auVar25._16_4_ + auVar35._16_4_;
  auVar41._20_4_ = auVar25._20_4_ + auVar35._20_4_;
  auVar41._24_4_ = auVar25._24_4_ + auVar35._24_4_;
  auVar41._28_4_ = auVar25._28_4_ + auVar35._28_4_;
  auVar59._0_4_ = auVar26._0_4_ + auVar36._0_4_;
  auVar59._4_4_ = auVar26._4_4_ + auVar36._4_4_;
  auVar59._8_4_ = auVar26._8_4_ + auVar36._8_4_;
  auVar59._12_4_ = auVar26._12_4_ + auVar36._12_4_;
  auVar59._16_4_ = auVar26._16_4_ + auVar36._16_4_;
  auVar59._20_4_ = auVar26._20_4_ + auVar36._20_4_;
  auVar59._24_4_ = auVar26._24_4_ + auVar36._24_4_;
  auVar59._28_4_ = auVar26._28_4_ + auVar36._28_4_;
  auVar60._0_4_ = auVar32._0_4_ + auVar29._0_4_;
  auVar60._4_4_ = auVar32._4_4_ + auVar29._4_4_;
  auVar60._8_4_ = auVar32._8_4_ + auVar29._8_4_;
  auVar60._12_4_ = auVar32._12_4_ + auVar29._12_4_;
  auVar60._16_4_ = auVar32._16_4_ + auVar29._16_4_;
  auVar60._20_4_ = auVar32._20_4_ + auVar29._20_4_;
  auVar60._24_4_ = auVar32._24_4_ + auVar29._24_4_;
  auVar60._28_4_ = auVar32._28_4_ + auVar29._28_4_;
  auVar54._0_4_ = auVar28._0_4_ + auVar33._0_4_;
  auVar54._4_4_ = auVar28._4_4_ + auVar33._4_4_;
  auVar54._8_4_ = auVar28._8_4_ + auVar33._8_4_;
  auVar54._12_4_ = auVar28._12_4_ + auVar33._12_4_;
  auVar54._16_4_ = auVar28._16_4_ + auVar33._16_4_;
  auVar54._20_4_ = auVar28._20_4_ + auVar33._20_4_;
  auVar54._24_4_ = auVar28._24_4_ + auVar33._24_4_;
  auVar54._28_4_ = auVar28._28_4_ + auVar33._28_4_;
  auVar33._8_4_ = 0x7f800000;
  auVar33._0_8_ = 0x7f8000007f800000;
  auVar33._12_4_ = 0x7f800000;
  auVar33._16_4_ = 0x7f800000;
  auVar33._20_4_ = 0x7f800000;
  auVar33._24_4_ = 0x7f800000;
  auVar33._28_4_ = 0x7f800000;
  auVar35 = vminps_avx(auVar33,auVar25);
  auVar36 = vminps_avx(auVar33,auVar26);
  auVar32 = vminps_avx(auVar33,auVar29);
  auVar33 = vminps_avx(auVar33,auVar28);
  auVar21 = vminps_avx512vl(auVar34,auVar41);
  auVar21 = vminps_avx512vl(auVar35,auVar21);
  auVar35 = vminps_avx512vl(auVar31,auVar59);
  auVar22 = vminps_avx512vl(auVar36,auVar35);
  auVar35 = vminps_avx512vl(auVar30,auVar60);
  auVar23 = vminps_avx512vl(auVar32,auVar35);
  auVar35 = vminps_avx512vl(auVar27,auVar54);
  auVar24 = vminps_avx512vl(auVar33,auVar35);
  auVar35 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  auVar36 = vmaxps_avx512vl(auVar35,auVar25);
  auVar32 = vmaxps_avx512vl(auVar35,auVar26);
  auVar33 = vmaxps_avx512vl(auVar35,auVar29);
  auVar28 = vmaxps_avx512vl(auVar35,auVar28);
  auVar35 = vmaxps_avx(auVar34,auVar41);
  auVar35 = vmaxps_avx(auVar36,auVar35);
  auVar36 = vmaxps_avx(auVar31,auVar59);
  auVar36 = vmaxps_avx(auVar32,auVar36);
  auVar32 = vmaxps_avx(auVar30,auVar60);
  auVar32 = vmaxps_avx(auVar33,auVar32);
  auVar33 = vmaxps_avx(auVar27,auVar54);
  auVar33 = vmaxps_avx(auVar28,auVar33);
  auVar34 = vshufps_avx(auVar21,auVar21,0xb1);
  auVar34 = vminps_avx(auVar21,auVar34);
  auVar31 = vshufpd_avx(auVar34,auVar34,5);
  auVar34 = vminps_avx(auVar34,auVar31);
  auVar38 = vminps_avx(auVar34._0_16_,auVar34._16_16_);
  auVar34 = vshufps_avx(auVar22,auVar22,0xb1);
  auVar34 = vminps_avx(auVar22,auVar34);
  auVar31 = vshufpd_avx(auVar34,auVar34,5);
  auVar34 = vminps_avx(auVar34,auVar31);
  auVar37 = vminps_avx(auVar34._0_16_,auVar34._16_16_);
  auVar37 = vunpcklps_avx(auVar38,auVar37);
  auVar34 = vshufps_avx(auVar23,auVar23,0xb1);
  auVar34 = vminps_avx(auVar23,auVar34);
  auVar31 = vshufpd_avx(auVar34,auVar34,5);
  auVar34 = vminps_avx(auVar34,auVar31);
  auVar38 = vminps_avx(auVar34._0_16_,auVar34._16_16_);
  auVar45 = vinsertps_avx(auVar37,auVar38,0x28);
  auVar34 = vshufps_avx(auVar35,auVar35,0xb1);
  auVar35 = vmaxps_avx(auVar35,auVar34);
  auVar34 = vshufpd_avx(auVar35,auVar35,5);
  auVar35 = vmaxps_avx(auVar35,auVar34);
  auVar38 = vmaxps_avx(auVar35._0_16_,auVar35._16_16_);
  auVar35 = vshufps_avx(auVar36,auVar36,0xb1);
  auVar35 = vmaxps_avx(auVar36,auVar35);
  auVar36 = vshufpd_avx(auVar35,auVar35,5);
  auVar35 = vmaxps_avx(auVar35,auVar36);
  auVar37 = vmaxps_avx(auVar35._0_16_,auVar35._16_16_);
  auVar37 = vunpcklps_avx(auVar38,auVar37);
  auVar35 = vshufps_avx(auVar32,auVar32,0xb1);
  auVar35 = vmaxps_avx(auVar32,auVar35);
  auVar36 = vshufpd_avx(auVar35,auVar35,5);
  auVar35 = vmaxps_avx(auVar35,auVar36);
  auVar38 = vmaxps_avx(auVar35._0_16_,auVar35._16_16_);
  auVar44 = vinsertps_avx(auVar37,auVar38,0x28);
  auVar35 = vshufps_avx(auVar24,auVar24,0xb1);
  auVar35 = vminps_avx(auVar24,auVar35);
  auVar36 = vshufpd_avx(auVar35,auVar35,5);
  auVar35 = vminps_avx(auVar35,auVar36);
  auVar38 = vminss_avx(auVar35._0_16_,auVar35._16_16_);
  auVar35 = vshufps_avx(auVar33,auVar33,0xb1);
  auVar35 = vmaxps_avx(auVar33,auVar35);
  auVar36 = vshufpd_avx(auVar35,auVar35,5);
  auVar35 = vmaxps_avx(auVar35,auVar36);
  auVar37 = vmaxss_avx(auVar35._0_16_,auVar35._16_16_);
  auVar49._8_4_ = 0x7fffffff;
  auVar49._0_8_ = 0x7fffffff7fffffff;
  auVar49._12_4_ = 0x7fffffff;
  auVar38 = vandps_avx(auVar38,auVar49);
  auVar37 = vandps_avx(auVar37,auVar49);
  auVar38 = vmaxss_avx(auVar37,auVar38);
  auVar43._0_4_ = auVar38._0_4_;
  auVar43._4_4_ = auVar43._0_4_;
  auVar43._8_4_ = auVar43._0_4_;
  auVar43._12_4_ = auVar43._0_4_;
  auVar45 = vsubps_avx(auVar45,auVar43);
  auVar39._0_4_ = auVar44._0_4_ + auVar43._0_4_;
  auVar39._4_4_ = auVar44._4_4_ + auVar43._0_4_;
  auVar39._8_4_ = auVar44._8_4_ + auVar43._0_4_;
  auVar39._12_4_ = auVar44._12_4_ + auVar43._0_4_;
  auVar38 = vandps_avx(auVar45,auVar49);
  auVar37 = vandps_avx(auVar39,auVar49);
  auVar38 = vmaxps_avx(auVar38,auVar37);
  auVar37 = vmovshdup_avx(auVar38);
  auVar37 = vmaxss_avx(auVar37,auVar38);
  auVar38 = vshufpd_avx(auVar38,auVar38,1);
  auVar38 = vmaxss_avx(auVar38,auVar37);
  fVar2 = auVar38._0_4_ * 4.7683716e-07;
  auVar44._4_4_ = fVar2;
  auVar44._0_4_ = fVar2;
  auVar44._8_4_ = fVar2;
  auVar44._12_4_ = fVar2;
  aVar3 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar45,auVar44);
  (__return_storage_ptr__->lower).field_0 = aVar3;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar39._0_4_ + fVar2;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar39._4_4_ + fVar2;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar39._8_4_ + fVar2;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar39._12_4_ + fVar2;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(const Vec3fa& ofs, const float scale, const float r_scale0, const LinearSpace3fa& space, size_t i, size_t itime = 0) const {
        return bounds(ofs,scale,r_scale0,space,i,itime);
      }